

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

void helicsTranslatorSetOption(HelicsTranslator trans,int option,int value,HelicsError *err)

{
  HelicsTranslator pvVar1;
  bool bVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (trans == (HelicsTranslator)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001b41b5;
    }
    else {
      bVar2 = *(int *)((long)trans + 4) == -0x4c83cad2;
      pvVar1 = (HelicsTranslator)0x0;
      if (bVar2) {
        pvVar1 = trans;
      }
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_001b41b7;
    }
    err->error_code = -3;
    err->message = "The given translator object is not valid";
  }
LAB_001b41b5:
  pvVar1 = (HelicsTranslator)0x0;
LAB_001b41b7:
  if (pvVar1 != (HelicsTranslator)0x0) {
    (**(code **)(**(long **)((long)pvVar1 + 8) + 0x10))();
  }
  return;
}

Assistant:

void helicsTranslatorSetOption(HelicsTranslator trans, int option, int value, HelicsError* err)
{
    auto* transObj = getTranslatorObj(trans, err);
    if (transObj == nullptr) {
        return;
    }
    try {
        transObj->transPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}